

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitDefaultFramebufferCase::render
          (BlitDefaultFramebufferCase *this,Surface *dst)

{
  DataType type;
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int dstY1;
  TextureFormat texFormat;
  TransferFormat TVar4;
  DataTypes *samplerTypes;
  Context *pCVar5;
  RenderContext *pRVar6;
  float *value;
  ContextWrapper *pCVar7;
  Vector<float,_3> local_3e4;
  Vector<float,_3> local_3d8;
  Vector<float,_4> local_3cc;
  Vector<float,_3> local_3bc;
  Vector<float,_3> local_3b0;
  Vector<float,_4> local_3a4;
  Vector<float,_4> local_394;
  undefined4 local_384;
  undefined4 local_380;
  int texH;
  int texW;
  deUint32 tex;
  deUint32 fbo;
  deUint32 texShaderID;
  deUint32 gradShaderID;
  Vector<float,_4> local_35c;
  TextureFormat local_340;
  DataTypes local_338;
  undefined1 local_320 [8];
  Texture2DShader texShader;
  GradientShader gradShader;
  deUint32 local_28;
  deUint32 dStack_24;
  TransferFormat transferFmt;
  TextureFormat colorFormat;
  Surface *dst_local;
  BlitDefaultFramebufferCase *this_local;
  
  texFormat = glu::mapGLInternalFormat(this->m_format);
  TVar4 = glu::getTransferFormat(texFormat);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&texShader.m_outputType,TYPE_FLOAT_VEC4);
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_338);
  local_340 = texFormat;
  type = glu::getSampler2DType(texFormat);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_338,type);
  tcu::Vector<float,_4>::Vector(&local_35c,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texShaderID,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_320,samplerTypes,TYPE_FLOAT_VEC4,&local_35c,
             (Vec4 *)&texShaderID);
  FboTestUtil::DataTypes::~DataTypes(&local_338);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  fbo = (*pCVar5->_vptr_Context[0x75])(pCVar5,&texShader.m_outputType);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  tex = (*pCVar5->_vptr_Context[0x75])(pCVar5,local_320);
  texW = 0;
  texH = 0;
  local_380 = 0x80;
  local_384 = 0x80;
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = fbo;
  tcu::Vector<float,_4>::Vector(&local_394,0.0);
  tcu::Vector<float,_4>::Vector(&local_3a4,1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)&texShader.m_outputType,pCVar5,dVar1,&local_394,&local_3a4);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_320,pCVar5,tex);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&texW);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&texH);
  sglr::ContextWrapper::glBindTexture(&(this->super_FboTestCase).super_ContextWrapper,0xde1,texH);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,this->m_filter);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,this->m_filter);
  local_28 = TVar4.format;
  dStack_24 = TVar4.dataType;
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0,this->m_format,0x80,0x80,0,
             local_28,dStack_24,(void *)0x0);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,texW);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0xde1,texH,0);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  pRVar6 = gles3::Context::getRenderContext((this->super_FboTestCase).super_TestCase.m_context);
  dVar1 = (*pRVar6->_vptr_RenderContext[6])();
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,dVar1);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = fbo;
  tcu::Vector<float,_3>::Vector(&local_3b0,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_3bc,1.0,1.0,0.0);
  sglr::drawQuad(pCVar5,dVar1,&local_3b0,&local_3bc);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,texW);
  pCVar7 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(pCVar7);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glBlitFramebuffer
            (pCVar7,0,0,iVar2,iVar3,0,0,0x80,0x80,0x4000,this->m_filter);
  pRVar6 = gles3::Context::getRenderContext((this->super_FboTestCase).super_TestCase.m_context);
  dVar1 = (*pRVar6->_vptr_RenderContext[6])();
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca9,dVar1);
  tcu::Vector<float,_4>::Vector(&local_3cc,1.0,0.0,0.0,1.0);
  value = tcu::Vector<float,_4>::getPtr(&local_3cc);
  sglr::ContextWrapper::glClearBufferfv
            (&(this->super_FboTestCase).super_ContextWrapper,0x1800,0,value);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = tex;
  tcu::Vector<float,_3>::Vector(&local_3d8,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_3e4,0.0,1.0,0.0);
  sglr::drawQuad(pCVar5,dVar1,&local_3d8,&local_3e4);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,texW);
  pCVar7 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(pCVar7);
  iVar3 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  dstY1 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glBlitFramebuffer
            (pCVar7,0,0,0x80,0x80,iVar2 / 2,0,iVar3,dstY1,0x4000,this->m_filter);
  pRVar6 = gles3::Context::getRenderContext((this->super_FboTestCase).super_TestCase.m_context);
  dVar1 = (*pRVar6->_vptr_RenderContext[6])();
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8ca8,dVar1);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar2,iVar3);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_320);
  FboTestUtil::GradientShader::~GradientShader((GradientShader *)&texShader.m_outputType);
  return;
}

Assistant:

virtual void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFormat		= glu::mapGLInternalFormat(m_format);
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(colorFormat);
		GradientShader			gradShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader			texShader		(DataTypes() << glu::getSampler2DType(colorFormat), glu::TYPE_FLOAT_VEC4);
		deUint32				gradShaderID	= getCurrentContext()->createProgram(&gradShader);
		deUint32				texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32				fbo				= 0;
		deUint32				tex				= 0;
		const int				texW			= 128;
		const int				texH			= 128;

		// Setup shaders
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		texShader.setUniforms(*getCurrentContext(), texShaderID);

		// FBO
		glGenFramebuffers(1, &fbo);
		glGenTextures(1, &tex);

		glBindTexture(GL_TEXTURE_2D, tex);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	m_filter);
		glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	m_filter);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, texW, texH, 0, transferFmt.format, transferFmt.dataType, DE_NULL);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		// Render gradient to screen.
		glBindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Blit gradient from screen to fbo.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, getWidth(), getHeight(), 0, 0, texW, texH, GL_COLOR_BUFFER_BIT, m_filter);

		// Fill left half of viewport with quad that uses texture.
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		glClearBufferfv(GL_COLOR, 0, Vec4(1.0f, 0.0f, 0.0f, 1.0f).getPtr());
		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));

		// Blit fbo to right half.
		glBindFramebuffer(GL_READ_FRAMEBUFFER, fbo);
		glBlitFramebuffer(0, 0, texW, texH, getWidth()/2, 0, getWidth(), getHeight(), GL_COLOR_BUFFER_BIT, m_filter);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
		readPixels(dst, 0, 0, getWidth(), getHeight());
	}